

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UdpEntrySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpEntrySyntax,slang::syntax::SyntaxList<slang::syntax::UdpFieldBaseSyntax>const&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&,slang::syntax::UdpFieldBaseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::UdpFieldBaseSyntax> *args,Token *args_1,
          UdpFieldBaseSyntax **args_2,Token *args_3,UdpFieldBaseSyntax **args_4,Token *args_5)

{
  UdpFieldBaseSyntax *pUVar1;
  UdpFieldBaseSyntax *pUVar2;
  size_t sVar3;
  pointer ppUVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  SyntaxNode *pSVar8;
  undefined4 uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  TokenKind TVar18;
  undefined1 uVar19;
  NumericTokenFlags NVar20;
  uint32_t uVar21;
  UdpEntrySyntax *pUVar22;
  long lVar23;
  
  pUVar22 = (UdpEntrySyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UdpEntrySyntax *)this->endPtr < pUVar22 + 1) {
    pUVar22 = (UdpEntrySyntax *)allocateSlow(this,0x90,8);
  }
  else {
    this->head->current = (byte *)(pUVar22 + 1);
  }
  TVar10 = args_1->kind;
  uVar11 = args_1->field_0x2;
  NVar12.raw = (args_1->numFlags).raw;
  uVar13 = args_1->rawLen;
  pIVar5 = args_1->info;
  pUVar1 = *args_2;
  TVar14 = args_3->kind;
  uVar15 = args_3->field_0x2;
  NVar16.raw = (args_3->numFlags).raw;
  uVar17 = args_3->rawLen;
  pIVar6 = args_3->info;
  pUVar2 = *args_4;
  TVar18 = args_5->kind;
  uVar19 = args_5->field_0x2;
  NVar20.raw = (args_5->numFlags).raw;
  uVar21 = args_5->rawLen;
  pIVar7 = args_5->info;
  (pUVar22->super_SyntaxNode).kind = UdpEntry;
  (pUVar22->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pUVar22->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar9 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar8 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pUVar22->inputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pUVar22->inputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pUVar22->inputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar8;
  (pUVar22->inputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pUVar22->inputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (pUVar22->inputs).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pUVar22->inputs).super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pUVar22->inputs).super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar3;
  (pUVar22->inputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a66e0
  ;
  (pUVar22->colon1).kind = TVar10;
  (pUVar22->colon1).field_0x2 = uVar11;
  (pUVar22->colon1).numFlags = (NumericTokenFlags)NVar12.raw;
  (pUVar22->colon1).rawLen = uVar13;
  (pUVar22->colon1).info = pIVar5;
  pUVar22->current = pUVar1;
  (pUVar22->colon2).kind = TVar14;
  (pUVar22->colon2).field_0x2 = uVar15;
  (pUVar22->colon2).numFlags = (NumericTokenFlags)NVar16.raw;
  (pUVar22->colon2).rawLen = uVar17;
  (pUVar22->colon2).info = pIVar6;
  pUVar22->next = pUVar2;
  (pUVar22->semi).kind = TVar18;
  (pUVar22->semi).field_0x2 = uVar19;
  (pUVar22->semi).numFlags = (NumericTokenFlags)NVar20.raw;
  (pUVar22->semi).rawLen = uVar21;
  (pUVar22->semi).info = pIVar7;
  (pUVar22->inputs).super_SyntaxListBase.super_SyntaxNode.parent = &pUVar22->super_SyntaxNode;
  sVar3 = (pUVar22->inputs).super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar3 != 0) {
    ppUVar4 = (pUVar22->inputs).
              super_span<slang::syntax::UdpFieldBaseSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar23 = 0;
    do {
      *(UdpEntrySyntax **)(*(long *)((long)ppUVar4 + lVar23) + 8) = pUVar22;
      lVar23 = lVar23 + 8;
    } while (sVar3 << 3 != lVar23);
  }
  if (pUVar1 != (UdpFieldBaseSyntax *)0x0) {
    (pUVar1->super_SyntaxNode).parent = &pUVar22->super_SyntaxNode;
  }
  if (pUVar2 != (UdpFieldBaseSyntax *)0x0) {
    (pUVar2->super_SyntaxNode).parent = &pUVar22->super_SyntaxNode;
  }
  return pUVar22;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }